

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.c++
# Opt level: O3

Builder * __thiscall
capnp::Orphan<capnp::DynamicStruct>::get
          (Builder *__return_storage_ptr__,Orphan<capnp::DynamicStruct> *this)

{
  RawBrandedSchema *pRVar1;
  uint uVar2;
  ushort uVar3;
  Schema local_58;
  Reader local_50;
  
  pRVar1 = (this->schema).super_Schema.raw;
  local_58.raw = pRVar1;
  Schema::getProto(&local_50,&local_58);
  uVar2 = 0;
  if (local_50._reader.dataSize < 0x80) {
    uVar3 = 0;
  }
  else {
    uVar3 = *(ushort *)((long)local_50._reader.data + 0xe);
    if (0xcf < local_50._reader.dataSize) {
      uVar2 = (uint)*(ushort *)((long)local_50._reader.data + 0x18) << 0x10;
    }
  }
  _::OrphanBuilder::asStruct
            (&__return_storage_ptr__->builder,&this->builder,(StructSize)(uVar3 | uVar2));
  (__return_storage_ptr__->schema).super_Schema.raw = pRVar1;
  return __return_storage_ptr__;
}

Assistant:

DynamicStruct::Builder Orphan<DynamicStruct>::get() {
  return DynamicStruct::Builder(schema, builder.asStruct(structSizeFromSchema(schema)));
}